

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_insn_decoder.c
# Opt level: O0

int event_pending(pt_insn_decoder *decoder)

{
  int status;
  pt_insn_decoder *decoder_local;
  
  if (decoder == (pt_insn_decoder *)0x0) {
    decoder_local._4_4_ = -2;
  }
  else if ((*(ushort *)&decoder->field_0xb00 >> 1 & 1) == 0) {
    if ((decoder->status & 1U) == 0) {
      decoder_local._4_4_ = 0;
    }
    else {
      decoder_local._4_4_ = pt_qry_event(&decoder->query,&decoder->event,0x48);
      if (-1 < decoder_local._4_4_) {
        *(ushort *)&decoder->field_0xb00 = *(ushort *)&decoder->field_0xb00 & 0xfffd | 2;
        decoder->status = decoder_local._4_4_;
        decoder_local._4_4_ = 1;
      }
    }
  }
  else {
    decoder_local._4_4_ = 1;
  }
  return decoder_local._4_4_;
}

Assistant:

static inline int event_pending(struct pt_insn_decoder *decoder)
{
	int status;

	if (!decoder)
		return -pte_invalid;

	if (decoder->process_event)
		return 1;

	status = decoder->status;
	if (!(status & pts_event_pending))
		return 0;

	status = pt_qry_event(&decoder->query, &decoder->event,
			      sizeof(decoder->event));
	if (status < 0)
		return status;

	decoder->process_event = 1;
	decoder->status = status;
	return 1;
}